

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::AllocateNewLifetimes(LinearScan *this,Instr *instr)

{
  anon_union_8_3_6c1fdb8e_for_scratch aVar1;
  Lifetime *spilledRange;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  bool bVar2;
  RegNum reg;
  uint32 uVar3;
  uint32 uVar4;
  uint uVar5;
  RegOpnd *pRVar6;
  RegOpnd *pRVar7;
  Type *ppLVar8;
  
  bVar2 = SkipNumberedInstr(this,instr);
  if (bVar2) {
    return;
  }
  if (((((instr->m_src1 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsRegOpnd(instr->m_src1), bVar2)) &&
       (bVar2 = LowererMD::IsAssign(instr), bVar2)) &&
      ((instr->m_dst != (Opnd *)0x0 && (bVar2 = IR::Opnd::IsRegOpnd(instr->m_dst), bVar2)))) &&
     (pRVar6 = IR::Opnd::AsRegOpnd(instr->m_dst), pRVar6->m_sym != (StackSym *)0x0)) {
    pRVar6 = IR::Opnd::AsRegOpnd(instr->m_src1);
    if ((pRVar6->m_sym == (StackSym *)0x0) ||
       (uVar4 = *(uint32 *)((long)pRVar6->m_sym->scratch + 0x7c),
       uVar3 = IR::Instr::GetNumber(instr), uVar4 == uVar3)) {
      pRVar7 = IR::Opnd::AsRegOpnd(instr->m_dst);
      aVar1 = pRVar7->m_sym->scratch;
      if (aVar1 != (anon_union_8_3_6c1fdb8e_for_scratch)0x0) {
        BVUnitT<unsigned_long>::Set
                  ((BVUnitT<unsigned_long> *)((long)aVar1 + 0x70),(uint)pRVar6->m_reg);
      }
    }
  }
  do {
    while( true ) {
      while( true ) {
        this_00 = this->lifetimeList;
        if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            (this_00->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListNodeBase<Memory::ArenaAllocator>.next == this_00) {
          return;
        }
        ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                            (&this_00->
                              super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
        uVar5 = (*ppLVar8)->start;
        uVar4 = IR::Instr::GetNumber(instr);
        if (uVar4 < uVar5) {
          return;
        }
        ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                            (&this->lifetimeList->
                              super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
        spilledRange = *ppLVar8;
        uVar4 = IR::Instr::GetNumber(instr);
        spilledRange->lastAllocationStart = uVar4;
        SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead(this->lifetimeList);
        uVar5 = *(uint *)&spilledRange->field_0x9c;
        if ((uVar5 >> 8 & 1) == 0) break;
        SpillLiveRange(this,spilledRange,(Instr *)0x0);
      }
      reg = spilledRange->reg;
      if (reg == RegNOREG) break;
      if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
        bVar2 = false;
      }
      else {
        uVar5 = spilledRange->end;
        uVar4 = IR::Instr::GetNumber(this->currentOpHelperBlock->opHelperEndInstr);
        bVar2 = uVar4 < uVar5;
      }
      SpillReg(this,reg,bVar2);
      uVar5 = *(uint *)&spilledRange->field_0x9c | 0x80;
      *(short *)&spilledRange->field_0x9c = (short)uVar5;
LAB_00530075:
      if ((uVar5 & 1) == 0) {
        AssignActiveReg(this,spilledRange,reg);
      }
    }
    if ((uVar5 & 8) == 0) {
      reg = FindReg(this,spilledRange,(RegOpnd *)0x0,false);
      uVar5 = (uint)*(ushort *)&spilledRange->field_0x9c;
      goto LAB_00530075;
    }
    *(ushort *)&spilledRange->field_0x9c = (ushort)uVar5 | 1;
  } while( true );
}

Assistant:

void
LinearScan::AllocateNewLifetimes(IR::Instr *instr)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    // Try to catch:
    //      x = MOV y(r1)
    // where y's lifetime just ended and x's lifetime is starting.
    // If so, set r1 as a preferred register for x, which may allow peeps to remove the MOV
    if (instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && LowererMD::IsAssign(instr) && instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->m_sym)
    {
        IR::RegOpnd *src = instr->GetSrc1()->AsRegOpnd();
        StackSym *srcSym = src->m_sym;
        // If src is a physReg ref, or src's lifetime ends here.
        if (!srcSym || srcSym->scratch.linearScan.lifetime->end == instr->GetNumber())
        {
            Lifetime *dstLifetime = instr->GetDst()->AsRegOpnd()->m_sym->scratch.linearScan.lifetime;
            if (dstLifetime)
            {
                dstLifetime->regPreference.Set(src->GetReg());
            }
        }
    }

    // Look for starting lifetimes
    while (!this->lifetimeList->Empty() && this->lifetimeList->Head()->start <= instr->GetNumber())
    {
        // We're at the start of a new live range

        Lifetime * newLifetime = this->lifetimeList->Head();
        newLifetime->lastAllocationStart = instr->GetNumber();

        this->lifetimeList->RemoveHead();

        if (newLifetime->dontAllocate)
        {
            // Lifetime spilled before beginning allocation (e.g., a lifetime known to span
            // multiple EH regions.) Do the work of spilling it now without adding it to the list.
            this->SpillLiveRange(newLifetime);
            continue;
        }

        RegNum reg;
        if (newLifetime->reg == RegNOREG)
        {
            if (newLifetime->isDeadStore)
            {
                // No uses, let's not waste a reg.
                newLifetime->isSpilled = true;
                continue;
            }
            reg = this->FindReg(newLifetime, nullptr);
        }
        else
        {
            // This lifetime is already assigned a physical register.  Make
            // sure that register is available by calling SpillReg
            reg = newLifetime->reg;

            // If we're in a helper block, the physical register we're trying to ensure is available might get helper
            // spilled. Don't allow that if this lifetime's end lies beyond the end of the helper block because
            // spill code assumes that this physical register isn't active at the end of the helper block when it tries
            // to restore it. So we'd have to really spill the lifetime then anyway.
            this->SpillReg(reg, IsInHelperBlock() ? (newLifetime->end > currentOpHelperBlock->opHelperEndInstr->GetNumber()) : false);
            newLifetime->cantSpill = true;
        }

        // If we did get a register for this lifetime, add it to the active set.
        if (newLifetime->isSpilled == false)
        {
            this->AssignActiveReg(newLifetime, reg);
        }
    }
}